

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O0

void __thiscall Clasp::CBConsequences::CBConsequences(CBConsequences *this,Type type,Algo algo)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  Enumerator *unaff_retaddr;
  
  Enumerator::Enumerator(unaff_retaddr);
  *in_RDI = &PTR__CBConsequences_002df440;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)unaff_retaddr);
  in_RDI[0x10] = 0;
  *(undefined4 *)(in_RDI + 0x11) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x8c) = in_EDX;
  if (*(int *)(in_RDI + 0x11) != 2) {
    *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  }
  return;
}

Assistant:

CBConsequences::CBConsequences(Type type, Algo algo)
	: Enumerator()
	, shared_(0)
	, type_(type)
	, algo_(algo) {
	if (type_ != Cautious) { algo_ = Default; }
}